

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator __thiscall
fmt::v9::detail::default_arg_formatter<char>::operator()
          (default_arg_formatter<char> *this,bool value)

{
  appender aVar1;
  undefined7 in_register_00000031;
  locale_ref in_R8;
  
  aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container._1_7_ =
       in_register_00000031;
  aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container._0_1_ = value;
  aVar1 = write<char,_fmt::v9::appender,_bool,_0>
                    ((detail *)
                     (this->out).super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                     container,aVar1,true,(basic_format_specs<char> *)0x0,in_R8);
  return (iterator)aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
}

Assistant:

auto operator()(T value) -> iterator {
    return write<Char>(out, value);
  }